

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall dataset::dataset(dataset *this,string *dataLine)

{
  size_type sVar1;
  string *dataLine_local;
  dataset *this_local;
  
  ftrl_data<float>::ftrl_data(&this->data);
  std::__cxx11::string::string((string *)&this->dataLine,(string *)dataLine);
  readLine(this);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(this->data).indexs);
  this->length = (uint)sVar1;
  return;
}

Assistant:

dataset::dataset(string & dataLine)
        : dataLine(dataLine) {
    readLine();
    length = (unsigned int)data.indexs.size();
}